

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleFillTest::render
          (TriangleFillTest *this,Context *ctx)

{
  uint uVar1;
  MessageBuilder *pMVar2;
  size_type sVar3;
  reference pvVar4;
  float *pfVar5;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *p_01;
  MessageBuilder local_b08;
  MessageBuilder local_988;
  MessageBuilder local_808;
  MessageBuilder local_688;
  undefined1 local_508 [8];
  string v2Properties;
  string v1Properties;
  string v0Properties;
  size_t ndx;
  MessageBuilder local_320;
  TestLog *local_1a0;
  TestLog *log;
  uint local_190;
  GLint colorLoc;
  GLint positionLoc;
  uint local_17c;
  undefined1 local_178 [4];
  deUint32 programId;
  PositionColorShader program;
  int verticesPerTriangle;
  Context *ctx_local;
  TriangleFillTest *this_local;
  
  program.super_ShaderProgram._340_4_ = 3;
  PositionColorShader::PositionColorShader((PositionColorShader *)local_178);
  local_17c = (*ctx->_vptr_Context[0x75])(ctx,(PositionColorShader *)local_178);
  local_190 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)local_17c,"a_position");
  log._4_4_ = (*ctx->_vptr_Context[0x59])(ctx,(ulong)local_17c,"a_color");
  local_1a0 = tcu::TestContext::getLog
                        ((this->super_FillTest).super_RenderTestCase.super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_320,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_320,(char (*) [16])"Viewport: left=");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_FillTest).m_viewport.left);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])"\tbottom=");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_FillTest).m_viewport.bottom);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])"\twidth=");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_FillTest).m_viewport.width);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])"\theight=");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_FillTest).m_viewport.height);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_320);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx,(char (*) [34])"Rendering triangles. Coordinates:");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  v0Properties.field_2._8_8_ = 0;
  while( true ) {
    sVar3 = std::
            vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
            ::size(&this->m_triangles);
    if (sVar3 <= (ulong)v0Properties.field_2._8_8_) break;
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)((long)&v1Properties.field_2 + 8),(_anonymous_namespace_ *)pvVar4,p);
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)((long)&v2Properties.field_2 + 8),(_anonymous_namespace_ *)&pvVar4->v1,p_00
              );
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)local_508,(_anonymous_namespace_ *)&pvVar4->v2,p_01);
    tcu::TestLog::operator<<(&local_688,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [8])"\tv0 (x=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::x(&pvVar4->v0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\ty=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::y(&pvVar4->v0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tz=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::z(&pvVar4->v0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tw=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::w(&pvVar4->v0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])")\t");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&v1Properties.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_688);
    tcu::TestLog::operator<<(&local_808,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_808,(char (*) [8])"\tv1 (x=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::x(&pvVar4->v1);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\ty=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::y(&pvVar4->v1);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tz=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::z(&pvVar4->v1);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tw=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::w(&pvVar4->v1);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])")\t");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&v2Properties.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_808);
    tcu::TestLog::operator<<(&local_988,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_988,(char (*) [8])"\tv2 (x=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::x(&pvVar4->v2);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\ty=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::y(&pvVar4->v2);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tz=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::z(&pvVar4->v2);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])"\tw=");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ::operator[](&this->m_triangles,v0Properties.field_2._8_8_);
    pfVar5 = tcu::Vector<float,_4>::w(&pvVar4->v2);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pfVar5);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])")\t");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_508);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_988);
    tcu::TestLog::operator<<(&local_b08,local_1a0,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<(&local_b08,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b08);
    std::__cxx11::string::~string((string *)local_508);
    std::__cxx11::string::~string((string *)(v2Properties.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(v1Properties.field_2._M_local_buf + 8));
    v0Properties.field_2._8_8_ = v0Properties.field_2._8_8_ + 1;
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*ctx->_vptr_Context[0x2b])(0x3f800000);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4100);
  (*ctx->_vptr_Context[5])
            (ctx,(ulong)(uint)(this->super_FillTest).m_viewport.left,
             (ulong)(uint)(this->super_FillTest).m_viewport.bottom,
             (ulong)(uint)(this->super_FillTest).m_viewport.width,
             (ulong)(uint)(this->super_FillTest).m_viewport.height);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)local_17c);
  (*ctx->_vptr_Context[0x41])(ctx,1);
  (*ctx->_vptr_Context[0x33])(ctx,0xbe2);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)local_190);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)log._4_4_);
  uVar1 = local_190;
  pvVar4 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
           ::operator[](&this->m_triangles,0);
  (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0x20,pvVar4);
  uVar1 = log._4_4_;
  pvVar4 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
           ::operator[](&this->m_triangles,0);
  (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0x20,&pvVar4->c0);
  sVar3 = std::
          vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
          ::size(&this->m_triangles);
  (*ctx->_vptr_Context[0x68])(ctx,4,0,(ulong)(uint)((int)sVar3 * 3));
  (*ctx->_vptr_Context[0x51])(ctx,(ulong)local_190);
  (*ctx->_vptr_Context[0x51])(ctx,(ulong)log._4_4_);
  (*ctx->_vptr_Context[0x76])(ctx,0);
  (*ctx->_vptr_Context[0x77])(ctx,(ulong)local_17c);
  (*ctx->_vptr_Context[0x7a])();
  PositionColorShader::~PositionColorShader((PositionColorShader *)local_178);
  return;
}

Assistant:

void TriangleFillTest::render (sglr::Context& ctx)
{
	const int			verticesPerTriangle		= 3;
	PositionColorShader program;
	const deUint32		programId				= ctx.createProgram(&program);
	const GLint			positionLoc				= ctx.getAttribLocation(programId, "a_position");
	const GLint			colorLoc				= ctx.getAttribLocation(programId, "a_color");
	tcu::TestLog&		log						= m_testCtx.getLog();

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_triangles.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_triangles[ndx].v0);
		const std::string v1Properties = genClippingPointInfoString(m_triangles[ndx].v1);
		const std::string v2Properties = genClippingPointInfoString(m_triangles[ndx].v2);

		log << TestLog::Message << "\tv0 (x=" << m_triangles[ndx].v0.x() << "\ty=" << m_triangles[ndx].v0.y() << "\tz=" << m_triangles[ndx].v0.z() << "\tw=" << m_triangles[ndx].v0.w() << ")\t" << v0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_triangles[ndx].v1.x() << "\ty=" << m_triangles[ndx].v1.y() << "\tz=" << m_triangles[ndx].v1.z() << "\tw=" << m_triangles[ndx].v1.w() << ")\t" << v1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_triangles[ndx].v2.x() << "\ty=" << m_triangles[ndx].v2.y() << "\tz=" << m_triangles[ndx].v2.z() << "\tw=" << m_triangles[ndx].v2.w() << ")\t" << v2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	ctx.clearColor					(0, 0, 0, 1);
	ctx.clearDepthf					(1.0f);
	ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
	ctx.useProgram					(programId);
	ctx.blendFunc					(GL_ONE, GL_ONE);
	ctx.enable						(GL_BLEND);
	ctx.enableVertexAttribArray		(positionLoc);
	ctx.enableVertexAttribArray		(colorLoc);
	ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].v0);
	ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].c0);
	ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_triangles.size());
	ctx.disableVertexAttribArray	(positionLoc);
	ctx.disableVertexAttribArray	(colorLoc);
	ctx.useProgram					(0);
	ctx.deleteProgram				(programId);
	ctx.finish						();
}